

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O2

void __thiscall tt::Logger::Logger(Logger *this,char *fileName,int line)

{
  Impl::Impl(&this->m_impl,fileName,line);
  return;
}

Assistant:

Logger::Logger(const char* fileName, int line)
	:m_impl(fileName,line){
	
	}